

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t uloc_minimizeSubtags_63
                  (char *localeID,char *minimizedLocaleID,int32_t minimizedLocaleIDCapacity,
                  UErrorCode *err)

{
  char cVar1;
  int iVar2;
  UBool UVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  char *script_00;
  char *region_00;
  char *__s;
  int32_t iVar10;
  int32_t langLength;
  int32_t regionLength;
  int32_t scriptLength;
  char region [4];
  char script [6];
  char lang [12];
  char tagBuffer [157];
  char maximizedTagBuffer [157];
  char localeBuffer [157];
  
  UVar3 = do_canonicalize(localeID,localeBuffer,(int32_t)err,err);
  if (UVar3 == '\0') {
    return -1;
  }
  langLength = 0xc;
  scriptLength = 6;
  regionLength = 4;
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  if (minimizedLocaleIDCapacity < 1 || minimizedLocaleID == (char *)0x0) {
LAB_0019dc3f:
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  iVar4 = parseTagString(localeBuffer,lang,&langLength,script,&scriptLength,region,&regionLength,err
                        );
  if (U_ZERO_ERROR < *err) {
    if (*err != U_BUFFER_OVERFLOW_ERROR) {
      return -1;
    }
    goto LAB_0019dc3f;
  }
  for (__s = localeBuffer + iVar4; (*__s == '_' || (*__s == '-')); __s = __s + 1) {
  }
  sVar7 = strlen(__s);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)sVar7) {
    uVar9 = sVar7 & 0xffffffff;
  }
  iVar6 = 0;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    cVar1 = __s[uVar8];
    iVar2 = 0;
    if ((cVar1 != '-') && (cVar1 != '_')) {
      if (cVar1 == '@') break;
      if (8 < iVar6) goto LAB_0019dc3f;
      iVar2 = iVar6 + 1;
    }
    iVar6 = iVar2;
  }
  createTagString(lang,langLength,script,scriptLength,region,regionLength,(char *)0x0,0,
                  maximizedTagBuffer,0x9d,err);
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  uloc_addLikelySubtags_63(maximizedTagBuffer,maximizedTagBuffer,0x9d,err);
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  uVar5 = createLikelySubtagsString
                    (lang,langLength,(char *)0x0,0,(char *)0x0,0,(char *)0x0,0,tagBuffer,0x9d,err);
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  iVar6 = uprv_strnicmp_63(maximizedTagBuffer,tagBuffer,uVar5);
  if (iVar6 == 0) {
    script_00 = (char *)0x0;
    iVar4 = 0;
  }
  else {
    if (regionLength < 1) goto LAB_0019de81;
    uVar5 = createLikelySubtagsString
                      (lang,langLength,(char *)0x0,0,region,regionLength,(char *)0x0,0,tagBuffer,
                       0x9d,err);
    if (U_ZERO_ERROR < *err) {
      return -1;
    }
    iVar6 = uprv_strnicmp_63(maximizedTagBuffer,tagBuffer,uVar5);
    if (iVar6 == 0) {
      region_00 = region;
      script_00 = (char *)0x0;
      iVar4 = 0;
      iVar10 = regionLength;
      goto LAB_0019ded6;
    }
    if ((scriptLength < 1) || (regionLength < 1)) {
LAB_0019de81:
      sVar7 = strlen(localeBuffer);
      iVar10 = (int32_t)sVar7;
      iVar4 = minimizedLocaleIDCapacity;
      if (iVar10 < minimizedLocaleIDCapacity) {
        iVar4 = iVar10;
      }
      memcpy(minimizedLocaleID,localeBuffer,(long)iVar4);
      iVar4 = u_terminateChars_63(minimizedLocaleID,minimizedLocaleIDCapacity,iVar10,err);
      return iVar4;
    }
    uVar5 = createLikelySubtagsString
                      (lang,langLength,script,scriptLength,(char *)0x0,0,(char *)0x0,0,tagBuffer,
                       0x9d,err);
    if (U_ZERO_ERROR < *err) {
      return -1;
    }
    iVar6 = uprv_strnicmp_63(maximizedTagBuffer,tagBuffer,uVar5);
    if (iVar6 != 0) goto LAB_0019de81;
    script_00 = script;
    iVar4 = scriptLength;
  }
  region_00 = (char *)0x0;
  iVar10 = 0;
LAB_0019ded6:
  iVar4 = createTagString(lang,langLength,script_00,iVar4,region_00,iVar10,__s,(int)sVar7,
                          minimizedLocaleID,minimizedLocaleIDCapacity,err);
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_minimizeSubtags(const char*    localeID,
         char* minimizedLocaleID,
         int32_t minimizedLocaleIDCapacity,
         UErrorCode* err)
{
    char localeBuffer[ULOC_FULLNAME_CAPACITY];

    if (!do_canonicalize(
        localeID,
        localeBuffer,
        sizeof(localeBuffer),
        err)) {
        return -1;
    }
    else {
        return _uloc_minimizeSubtags(
                    localeBuffer,
                    minimizedLocaleID,
                    minimizedLocaleIDCapacity,
                    err);
    }    
}